

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O1

DiyFp __thiscall FIX::double_conversion::Single::AsDiyFp(Single *this)

{
  uint uVar1;
  uint uVar2;
  uint32_t d32;
  uint uVar3;
  ulong uVar4;
  DiyFp DVar5;
  
  uVar1 = this->d32_;
  if ((int)uVar1 < 0) {
    __assert_fail("Sign() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                  ,0x117,"DiyFp FIX::double_conversion::Single::AsDiyFp() const");
  }
  uVar3 = uVar1 & 0x7f800000;
  if (uVar3 != 0x7f800000) {
    uVar2 = (uVar1 & 0x7fffff) + 0x800000;
    if (uVar3 == 0) {
      uVar2 = uVar1 & 0x7fffff;
    }
    DVar5.f_ = (ulong)uVar2;
    uVar4 = 0xffffff6b;
    if (uVar3 != 0) {
      uVar4 = (ulong)((uVar1 >> 0x17) - 0x96);
    }
    DVar5._8_8_ = uVar4;
    return DVar5;
  }
  __assert_fail("!IsSpecial()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                ,0x118,"DiyFp FIX::double_conversion::Single::AsDiyFp() const");
}

Assistant:

DiyFp AsDiyFp() const {
    ASSERT(Sign() > 0);
    ASSERT(!IsSpecial());
    return DiyFp(Significand(), Exponent());
  }